

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O3

void __thiscall WildMidi_Renderer::ComputeOutput(WildMidi_Renderer *this,float *fbuffer,int len)

{
  midi *handle;
  float *pfVar1;
  
  handle = this->handle;
  pfVar1 = (float *)WM_Mix(handle,(int *)fbuffer,(long)len);
  if ((*(byte *)((long)handle + 0x30) & 4) != 0) {
    _WM_do_reverb(*(_rvb **)((long)handle + 0x50378),(int *)fbuffer,len * 2);
  }
  if (fbuffer < pfVar1) {
    do {
      *fbuffer = (float)(int)*fbuffer * 3.0517578e-05;
      fbuffer = fbuffer + 1;
    } while (fbuffer < pfVar1);
  }
  return;
}

Assistant:

void WildMidi_Renderer::ComputeOutput(float *fbuffer, int len)
{
	_mdi *mdi = (_mdi *)handle;
	int *buffer = (int *)fbuffer;
	int *newbuf = WM_Mix(handle, buffer, len);
//	assert(newbuf - buffer == len);
	if (mdi->info.mixer_options & WM_MO_REVERB) {
		_WM_do_reverb(mdi->reverb, buffer, len * 2);
	}
	for (; buffer < newbuf; ++buffer)
	{
		*(float *)buffer = (float)*buffer / 32768.f;
	}
}